

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RayTracing.cpp
# Opt level: O0

Vec3 compute_sample_color(Ray *ray,Object *list,int depth)

{
  byte bVar1;
  int in_ECX;
  Ray *in_RDX;
  undefined8 in_RSI;
  hit_record_t *in_RDI;
  float fVar2;
  undefined8 extraout_XMM0_Qa;
  Vec3 VVar3;
  Vec3 _emitted;
  Vec3 _attenuation;
  Ray _scattered;
  hit_record_t _hit_record;
  Vec3 *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  byte in_stack_ffffffffffffff27;
  hit_record_t *this;
  Vec3 local_a8;
  Ray *in_stack_ffffffffffffff68;
  Vec3 local_90;
  Vec3 local_84;
  undefined1 local_78 [40];
  undefined1 local_50 [4];
  undefined1 local_4c [4];
  undefined1 local_48 [4];
  undefined1 local_44 [28];
  undefined4 local_28;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  Ray *ray_00;
  
  this = in_RDI;
  hit_record_t::hit_record_t(in_RDI);
  ray_00 = in_RDX;
  fVar2 = std::numeric_limits<float>::max();
  bVar1 = (**(code **)(*(long *)(in_RDX->m_origin).e + 0x10))(0x3a83126f,in_RDX,in_RSI,local_50);
  if ((bVar1 & 1) == 0) {
    VVar3 = compute_background_color(in_stack_ffffffffffffff68);
    fVar2 = VVar3.e[2];
  }
  else {
    Ray::Ray((Ray *)this);
    Vec3::Vec3(&local_84);
    (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffdc,local_28) + 0x18))
              (&local_90,(long *)CONCAT44(in_stack_ffffffffffffffdc,local_28),local_44,local_4c,
               local_48);
    if ((in_ECX < 0x32) &&
       (in_stack_ffffffffffffff27 =
             (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffdc,local_28) + 0x10))
                       ((long *)CONCAT44(in_stack_ffffffffffffffdc,local_28),in_RSI,local_50,
                        &local_84,local_78), (in_stack_ffffffffffffff27 & 1) != 0)) {
      compute_sample_color
                (ray_00,(Object *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                 in_stack_ffffffffffffffdc);
      operator*((Vec3 *)in_RDI,(Vec3 *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20)
               );
      VVar3 = operator+((Vec3 *)in_RDI,
                        (Vec3 *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
      fVar2 = VVar3.e[2];
      Vec3::~Vec3((Vec3 *)&stack0xffffffffffffff64);
      Vec3::~Vec3(&local_a8);
    }
    else {
      Vec3::Vec3((Vec3 *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                 in_stack_ffffffffffffff18);
    }
    Vec3::~Vec3(&local_90);
    Vec3::~Vec3(&local_84);
    Ray::~Ray((Ray *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
  }
  hit_record_t::~hit_record_t
            ((hit_record_t *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
  VVar3.e[2] = fVar2;
  VVar3.e[0] = (float)(int)extraout_XMM0_Qa;
  VVar3.e[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return (Vec3)VVar3.e;
}

Assistant:

Vec3
compute_sample_color(const Ray& ray, Object *list, int depth)
{
    hit_record_t _hit_record;
    if(list->Intersect(ray, RT_MIN_INTERSECTION_T, std::numeric_limits<float>::max(), _hit_record)) {
        Ray  _scattered;
        Vec3 _attenuation;
		Vec3 _emitted = _hit_record.m_material->Emitted(_hit_record.m_point, _hit_record.m_u, _hit_record.m_v);
        if (depth < RT_MAX_DEPTH && _hit_record.m_material->Scatter(ray, _hit_record, _attenuation, _scattered)) {
            return _emitted + _attenuation * compute_sample_color(_scattered, list, depth+1);
        }
        else {
            return _emitted;
        }
    }

    return compute_background_color(ray);
}